

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<capnp::Orphan<capnp::compiler::Token>_> *
kj::_::
CopyConstructArray_<kj::Array<capnp::Orphan<capnp::compiler::Token>_>,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_*,_true,_false>
::apply(Array<capnp::Orphan<capnp::compiler::Token>_> *pos,
       Array<capnp::Orphan<capnp::compiler::Token>_> *start,
       Array<capnp::Orphan<capnp::compiler::Token>_> *end)

{
  Array<capnp::Orphan<capnp::compiler::Token>_> *params;
  Array<capnp::Orphan<capnp::compiler::Token>_> *end_local;
  Array<capnp::Orphan<capnp::compiler::Token>_> *start_local;
  Array<capnp::Orphan<capnp::compiler::Token>_> *pos_local;
  
  end_local = start;
  start_local = pos;
  while (end_local != end) {
    params = mv<kj::Array<capnp::Orphan<capnp::compiler::Token>>>(end_local);
    ctor<kj::Array<capnp::Orphan<capnp::compiler::Token>>,kj::Array<capnp::Orphan<capnp::compiler::Token>>>
              (start_local,params);
    end_local = end_local + 1;
    start_local = start_local + 1;
  }
  return start_local;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }